

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O3

int orl_c_compl_bitaddr(em8051 *aCPU)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  
  puVar3 = aCPU->mSFR;
  bVar1 = aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC + 1U];
  bVar2 = puVar3[0x50];
  bVar5 = bVar2;
  if ((char)bVar1 < '\0') {
    if (aCPU->sfrread == (em8051sfrread)0x0) {
      uVar4 = (uint)puVar3[(ulong)(bVar1 & 0xfffffff8) - 0x80];
    }
    else {
      uVar4 = (*aCPU->sfrread)(aCPU,bVar1 & 0xfffffff8);
      puVar3 = aCPU->mSFR;
      bVar5 = puVar3[0x50];
    }
  }
  else {
    uVar4 = (uint)aCPU->mLowerData[(ulong)(bVar1 >> 3) + 0x20];
  }
  bVar6 = 0x80;
  if ((1 << (bVar1 & 7) & uVar4) != 0) {
    bVar6 = bVar2 & 0x80;
  }
  puVar3[0x50] = bVar6 | bVar5 & 0x7f;
  aCPU->mPC = aCPU->mPC + 2;
  return 0;
}

Assistant:

static int orl_c_compl_bitaddr(struct em8051 *aCPU)
{
    int address = OPERAND1;
    int carry = CARRY;
    if (address > 0x7f)
    {
        int bit = address & 7;
        int bitmask = (1 << bit);
        int value;
        address &= 0xf8;        
        if (aCPU->sfrread)
            value = aCPU->sfrread(aCPU, address);
        else
            value = aCPU->mSFR[address - 0x80];

        value = (value & bitmask) ? carry : 1;

        PSW = (PSW & ~PSWMASK_C) | (PSWMASK_C * value);
    }
    else
    {
        int bit = address & 7;
        int bitmask = (1 << bit);
        int value;
        address >>= 3;
        address += 0x20;
        value = (aCPU->mLowerData[address] & bitmask) ? carry : 1;
        PSW = (PSW & ~PSWMASK_C) | (PSWMASK_C * value);
    }
    PC += 2;
    return 0;
}